

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joiner_session.cpp
# Opt level: O0

void __thiscall ot::commissioner::JoinerSession::Connect(JoinerSession *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  element_type *peVar3;
  Error *aError;
  Error local_188;
  ErrorCode local_15c;
  ConnectHandler local_158;
  anon_class_8_1_8991fb9c local_138;
  anon_class_8_1_8991fb9c onConnected;
  Error local_128;
  uint local_fc;
  duration<long,_std::ratio<1L,_1000L>_> local_f8;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_f0;
  duration local_e8;
  allocator<unsigned_char> local_d9;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c8;
  undefined1 local_a0 [8];
  DtlsConfig dtlsConfig;
  Error error;
  JoinerSession *this_local;
  
  Error::Error((Error *)&dtlsConfig.mCaChain.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
  iVar2 = (*(this->mCommImpl->super_Commissioner)._vptr_Commissioner[3])();
  GetDtlsConfig((DtlsConfig *)local_a0,(Config *)CONCAT44(extraout_var,iVar2));
  local_d0._M_current = (char *)std::__cxx11::string::begin();
  local_d8._M_current = (char *)std::__cxx11::string::end();
  std::allocator<unsigned_char>::allocator(&local_d9);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_c8,local_d0,local_d8,
             &local_d9);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dtlsConfig,&local_c8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_c8);
  std::allocator<unsigned_char>::~allocator(&local_d9);
  local_f0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_fc = 80000;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<unsigned_int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_f8,&local_fc);
  local_e8.__r = (rep)std::chrono::operator+(&local_f0,&local_f8);
  (this->mExpirationTime).__d.__r = local_e8.__r;
  peVar3 = std::
           __shared_ptr_access<ot::commissioner::DtlsSession,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::DtlsSession,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mDtlsSession);
  DtlsSession::Init(&local_128,peVar3,(DtlsConfig *)local_a0);
  aError = Error::operator=((Error *)&dtlsConfig.mCaChain.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_128)
  ;
  onConnected.this._4_4_ = 0;
  bVar1 = commissioner::operator!=(aError,(ErrorCode *)((long)&onConnected.this + 4));
  Error::~Error(&local_128);
  if (!bVar1) {
    local_138.this = this;
    peVar3 = std::
             __shared_ptr_access<ot::commissioner::DtlsSession,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ot::commissioner::DtlsSession,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->mDtlsSession);
    std::function<void(ot::commissioner::DtlsSession&,ot::commissioner::Error)>::
    function<ot::commissioner::JoinerSession::Connect()::__0&,void>
              ((function<void(ot::commissioner::DtlsSession&,ot::commissioner::Error)> *)&local_158,
               &local_138);
    DtlsSession::Connect(peVar3,&local_158);
    std::function<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error)>::~function
              (&local_158);
  }
  local_15c = kNone;
  bVar1 = commissioner::operator!=
                    ((Error *)&dtlsConfig.mCaChain.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,&local_15c);
  if (bVar1) {
    Error::Error(&local_188,
                 (Error *)&dtlsConfig.mCaChain.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
    HandleConnect(this,&local_188);
    Error::~Error(&local_188);
  }
  DtlsConfig::~DtlsConfig((DtlsConfig *)local_a0);
  Error::~Error((Error *)&dtlsConfig.mCaChain.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void JoinerSession::Connect()
{
    Error error;

    auto dtlsConfig = GetDtlsConfig(mCommImpl.GetConfig());
    dtlsConfig.mPSK = {mJoinerPSKd.begin(), mJoinerPSKd.end()};

    mExpirationTime = Clock::now() + MilliSeconds(kDtlsHandshakeTimeoutMax * 1000 + kJoinerTimeout * 1000);

    SuccessOrExit(error = mDtlsSession->Init(dtlsConfig));

    {
        auto onConnected = [this](const DtlsSession &, Error aError) { HandleConnect(aError); };
        mDtlsSession->Connect(onConnected);
    }

exit:
    if (error != ErrorCode::kNone)
    {
        HandleConnect(error);
    }
}